

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_fgetcsv(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  io_private *pDev;
  jx9_int64 jVar1;
  char *pcVar2;
  jx9_value *pValue;
  int encl;
  int delim;
  int escape;
  void *in_stack_ffffffffffffffb8;
  int i;
  char *zLine;
  
  if ((((nArg < 1) || (((*apArg)->iFlags & 0x100) == 0)) ||
      (pDev = (io_private *)((*apArg)->x).pOther, pDev == (io_private *)0x0)) ||
     (pDev->iMagic != 0xfeac14)) {
    jx9_context_throw_error(pCtx,2,"Expecting an IO handle");
  }
  else if (pDev->pStream == (jx9_io_stream *)0x0) {
    jx9_context_throw_error_format
              (pCtx,2,
               "IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE"
               ,(pCtx->pFunc->sName).zString,"null_stream");
  }
  else {
    if (nArg == 1) {
      jVar1 = -1;
    }
    else {
      jVar1 = jx9_value_to_int64(apArg[1]);
    }
    jVar1 = StreamReadLine(pDev,&zLine,jVar1);
    if (0 < jVar1) {
      if ((uint)nArg < 3) {
        escape = 0x5c;
        encl = 0x22;
        delim = 0x2c;
      }
      else {
        delim = 0x2c;
        if (((apArg[2]->iFlags & 1) != 0) && (pcVar2 = jx9_value_to_string(apArg[2],&i), 0 < i)) {
          delim = (int)*pcVar2;
        }
        if (nArg == 3) {
          encl = 0x22;
        }
        else {
          encl = 0x22;
          if (((apArg[3]->iFlags & 1) != 0) && (pcVar2 = jx9_value_to_string(apArg[3],&i), 0 < i)) {
            encl = (int)*pcVar2;
          }
          if ((4 < (uint)nArg) && ((apArg[4]->iFlags & 1) != 0)) {
            pcVar2 = jx9_value_to_string(apArg[4],&i);
            escape = 0x5c;
            if (0 < i) {
              escape = (int)*pcVar2;
            }
            goto LAB_00135419;
          }
        }
        escape = 0x5c;
      }
LAB_00135419:
      pValue = jx9_context_new_array(pCtx);
      if (pValue != (jx9_value *)0x0) {
        jx9ProcessCsv(zLine,(int)jVar1,delim,encl,escape,(_func_sxi32_char_ptr_int_void_ptr *)pValue
                      ,in_stack_ffffffffffffffb8);
        jx9_result_value(pCtx,pValue);
        return 0;
      }
      jx9_context_throw_error(pCtx,1,"JX9 is running out of memory");
      jx9_result_null(pCtx);
      return 0;
    }
  }
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int jx9Builtin_fgetcsv(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	const char *zLine;
	io_private *pDev;
	jx9_int64 n, nLen;
	if( nArg < 1 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract our private data */
	pDev = (io_private *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid io_private instance */
	if( IO_PRIVATE_INVALID(pDev) ){
		/*Expecting an IO handle */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target IO stream device */
	pStream = pDev->pStream;
	if( pStream == 0  ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE", 
			jx9_function_name(pCtx), pStream ? pStream->zName : "null_stream"
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	nLen = -1;
	if( nArg > 1 ){
		/* Maximum data to read */
		nLen = jx9_value_to_int64(apArg[1]);
	}
	/* Perform the requested operation */
	n = StreamReadLine(pDev, &zLine, nLen);
	if( n < 1 ){
		/* EOF or IO error, return FALSE */
		jx9_result_bool(pCtx, 0);
	}else{
		jx9_value *pArray;
		int delim  = ',';   /* Delimiter */
		int encl   = '"' ;  /* Enclosure */
		int escape = '\\';  /* Escape character */
		if( nArg > 2 ){
			const char *zPtr;
			int i;
			if( jx9_value_is_string(apArg[2]) ){
				/* Extract the delimiter */
				zPtr = jx9_value_to_string(apArg[2], &i);
				if( i > 0 ){
					delim = zPtr[0];
				}
			}
			if( nArg > 3 ){
				if( jx9_value_is_string(apArg[3]) ){
					/* Extract the enclosure */
					zPtr = jx9_value_to_string(apArg[3], &i);
					if( i > 0 ){
						encl = zPtr[0];
					}
				}
				if( nArg > 4 ){
					if( jx9_value_is_string(apArg[4]) ){
						/* Extract the escape character */
						zPtr = jx9_value_to_string(apArg[4], &i);
						if( i > 0 ){
							escape = zPtr[0];
						}
					}
				}
			}
		}
		/* Create our array */
		pArray = jx9_context_new_array(pCtx);
		if( pArray == 0 ){
			jx9_context_throw_error(pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
			jx9_result_null(pCtx);
			return JX9_OK;
		}
		/* Parse the raw input */
		jx9ProcessCsv(zLine, (int)n, delim, encl, escape, jx9CsvConsumer, pArray);
		/* Return the freshly created array  */
		jx9_result_value(pCtx, pArray);
	}
	return JX9_OK;	
}